

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opcode.h
# Opt level: O2

void JitFFI::OpCode_x64::_push_pop_base<(unsigned_char)143,(unsigned_char)88,(unsigned_char)0>
               (JitFuncCreater *jfc,Register src)

{
  byte bVar1;
  
  bVar1 = (byte)src;
  if (src < r8) {
    bVar1 = bVar1 | 0x58;
  }
  else {
    if ((src & ~rdi) == r8) {
      JitFuncCreater::push(jfc,'A',bVar1 | 0x50);
      return;
    }
    if ((src & ~r15) != prax) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_c_cmakelists/CVM-Projects[P]JitFFI/include/opcode.h"
                    ,0x1dc,
                    "void JitFFI::OpCode_x64::_push_pop_base(JitFuncCreater &, Register) [PreCode = (unsigned char)\'\\x8f\', V1 = (unsigned char)\'X\', V2 = (unsigned char)\'\\x00\']"
                   );
    }
    if ((src & prdi) == prbp) {
      JitFuncCreater::push(jfc,0x8f,'E','\0');
      return;
    }
    if ((src & ~rdi) == prax) {
      JitFuncCreater::push(jfc,0x8f,bVar1 & 7);
    }
    else {
      JitFuncCreater::push(jfc,'A',0x8f,bVar1 & 7);
    }
    if ((src & prdi) != prsp) {
      return;
    }
    bVar1 = 0x24;
  }
  JitFuncCreater::push(jfc,bVar1);
  return;
}

Assistant:

inline void _push_pop_base(JitFuncCreater &jfc, Register src) {
			if (is_rxq0(src))
				jfc.push(V1 + get_code(src));
			else if (is_rxq1(src))
				jfc.push(0x41, V1 + get_code(src));
			else if (is_prxq(src)) {
				if (src == prbp || src == pr13) {
					jfc.push(PreCode, V2 + 0100 + get_code(src), 0x00);
				}
				else {
					if (is_prxq0(src))
						jfc.push(PreCode, V2 + get_code(src));
					else
						jfc.push(0x41, PreCode, V2 + get_code(src));
					if (src == prsp || src == pr12)
						jfc.push(0x24);
				}
			}
			else
				assert(false);
		}